

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQHash SVar1;
  SQObjectPtr *val_00;
  _HashNode *p_Var2;
  uint64_t uVar3;
  SQObjectPtr *in_RDX;
  SQTable *in_RSI;
  SQTable *in_RDI;
  uint32_t strIdBits;
  uint8_t insertPos;
  _HashNode *othern;
  SQHash mph;
  _HashNode *mp;
  _HashNode *n;
  SQHash h;
  uint64_t local_60;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _HashNode *local_48;
  _HashNode *local_38;
  SQTable *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  SVar1 = HashObj((SQObject *)in_RSI);
  val_00 = (SQObjectPtr *)(SVar1 & in_RDI->_numofnodes_minus_one);
  p_Var2 = _Get(in_RDI,(SQObjectPtr *)in_RSI,(SQHash)val_00);
  if (p_Var2 == (_HashNode *)0x0) {
    p_Var2 = in_RDI->_nodes + (long)val_00;
    local_38 = p_Var2;
    if ((p_Var2->key).super_SQObject._type != OT_NULL) {
      local_38 = in_RDI->_firstfree;
      SVar1 = HashObj(&(p_Var2->key).super_SQObject);
      if ((local_38 < p_Var2) &&
         (local_48 = in_RDI->_nodes + (SVar1 & in_RDI->_numofnodes_minus_one), local_48 != p_Var2))
      {
        for (; local_48->next != p_Var2; local_48 = local_48->next) {
        }
        local_48->next = local_38;
        ::SQObjectPtr::operator=
                  ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (SQObjectPtr *)in_RDI);
        ::SQObjectPtr::operator=
                  ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (SQObjectPtr *)in_RDI);
        local_38->next = p_Var2->next;
        ::SQObjectPtr::Null((SQObjectPtr *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        ::SQObjectPtr::Null((SQObjectPtr *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        p_Var2->next = (_HashNode *)0x0;
        local_38 = p_Var2;
      }
      else {
        local_38->next = p_Var2->next;
        p_Var2->next = local_38;
      }
    }
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (SQObjectPtr *)in_RDI);
    while( true ) {
      if (((in_RDI->_firstfree->key).super_SQObject._type == OT_NULL) &&
         (in_RDI->_firstfree->next == (_HashNode *)0x0)) {
        ::SQObjectPtr::operator=
                  ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (SQObjectPtr *)in_RDI);
        if ((*(SQObjectType *)
              &(in_RSI->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
             == OT_STRING) && (in_RDI->_numofnodes_minus_one < 0x20)) {
          if ((in_RDI->_classTypeId != 0) || (in_RDI->_usednodes == 0)) {
            if (in_RDI->_classTypeId == 0) {
              local_60 = 0xcbf29ce484222325;
            }
            else {
              local_60 = in_RDI->_classTypeId;
            }
            uVar3 = class_type_hash_update_1
                              (local_60,(uint8_t)(((long)local_38 - (long)in_RDI->_nodes) / 0x28));
            in_RDI->_classTypeId = uVar3;
            uVar3 = class_type_hash_update_4
                              (in_RDI->_classTypeId,
                               (uint32_t)
                               ((ulong)((SQObjectValue *)
                                       &(in_RSI->super_SQDelegable).super_SQCollectable.
                                        super_SQRefCounted._uiRef)->nInteger >> 3));
            in_RDI->_classTypeId = uVar3;
          }
        }
        else {
          in_RDI->_classTypeId = 0;
        }
        in_RDI->_usednodes = in_RDI->_usednodes + 1;
        return true;
      }
      if (in_RDI->_firstfree == in_RDI->_nodes) break;
      in_RDI->_firstfree = in_RDI->_firstfree + -1;
    }
    Rehash(this_00,SUB81((ulong)in_RSI >> 0x38,0));
    local_1 = NewSlot(in_RSI,in_RDX,val_00);
  }
  else {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (SQObjectPtr *)in_RDI);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &__restrict key,const SQObjectPtr &__restrict val  VT_DECL_ARG)
{
    assert(sq_type(key) != OT_NULL);
    SQHash h = HashObj(key) & _numofnodes_minus_one;
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        VT_CODE(if (var_trace_arg) n->varTrace = *var_trace_arg);
        VT_TRACE_SINGLE(n, val, _ss(this)->_root_vm);
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;

    //key not found I'll insert it
    //main pos is not free

    if(sq_type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & _numofnodes_minus_one;
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            VT_COPY_SINGLE(mp, n);
            mp->key.Null();
            mp->val.Null();
            VT_CLEAR_SINGLE(mp);
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (sq_type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            VT_CODE(if (var_trace_arg) mp->varTrace = *var_trace_arg);
            VT_TRACE_SINGLE(mp, val, _ss(this)->_root_vm);

            // update class type id
            if (sq_isstring(key) && (_numofnodes_minus_one < (1<<TBL_CLASS_TYPE_MEMBER_BITS))) {
                if (_classTypeId != 0 || _usednodes==0) {
                    uint8_t insertPos = mp - _nodes;
                    _classTypeId = class_type_hash_update_1(_classTypeId ? _classTypeId : CLASS_TYPE_HASH_INIT, insertPos);

                    // Use SQString address as identifier, strings are unique, immutable and strored in a table.
                    // That means that all script strings share the same reference to SQString.
                    // 32 provides more than realistic address range.
                    uint32_t strIdBits = uint32_t( (uintptr_t(_string(key)) >> 3) & 0xFFFFFFFF );
                    _classTypeId = class_type_hash_update_4(_classTypeId, strIdBits);
                }
            } else {
                _classTypeId = 0;
            }

            ++_usednodes;

            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val  VT_CODE(VT_COMMA var_trace_arg));
}